

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall PhPacker_Arg_d_Test::TestBody(PhPacker_Arg_d_Test *this)

{
  double *pdVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  double result;
  double expected;
  string str;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  undefined1 local_68 [8];
  _Storage local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  AssertHelper local_48;
  double local_40;
  double local_38;
  double local_30;
  string local_28;
  
  PhPacker::pack<double,_0>(&local_28,'d',1.234);
  PhPacker::unpack((PhPacker *)local_68,'d',&local_28);
  pdVar1 = (double *)std::__any_caster<double>((any *)local_68);
  if (pdVar1 == (double *)0x0) {
    std::__throw_bad_any_cast();
  }
  local_38 = *pdVar1;
  if (local_68 != (undefined1  [8])0x0) {
    (*(code *)local_68)(3,local_68,0);
    local_68 = (undefined1  [8])0x0;
  }
  local_40 = local_38;
  local_30 = 1.234;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_68,"result","expected",&local_40,&local_30);
  if (local_68[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_60._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_68 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._M_ptr);
    }
    PhPacker::pack<double,_0>((string *)local_68,'d',65232.123);
    std::__cxx11::string::operator=((string *)&local_28,(string *)local_68);
    if (local_68 != (undefined1  [8])(local_68 + 0x10)) {
      operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_68,'d',&local_28);
    pdVar1 = (double *)std::__any_caster<double>((any *)local_68);
    if (pdVar1 == (double *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_40 = *pdVar1;
    if (local_68 != (undefined1  [8])0x0) {
      (*(code *)local_68)(3,local_68,0);
      local_68 = (undefined1  [8])0x0;
    }
    local_30 = 65232.123;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)local_68,"result","expected",&local_40,&local_30);
    if (local_68[0] != (PhPacker)0x0) goto LAB_001114b6;
    testing::Message::Message((Message *)&local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_60._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x175,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
LAB_001114b6:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_d)
{
   std::string str = PhPacker::pack<double>('d', 1.234);
   double result = std::any_cast<double>(PhPacker::unpack('d', str));
   double expected = 1.234;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<double>('d', 65232.123);
   result = std::any_cast<double>(PhPacker::unpack('d', str));
   expected = 65232.123;
   GTEST_ASSERT_EQ(result, expected);
}